

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  byte bVar1;
  bool bVar2;
  uint32 uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint8 *puVar6;
  uint uVar7;
  uint uVar8;
  byte unaff_BPL;
  ulong uVar9;
  
  do {
    pbVar4 = input->buffer_;
    if (pbVar4 < input->buffer_end_) {
      bVar1 = *pbVar4;
      uVar9 = (ulong)bVar1;
      uVar3 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_0028d9ec;
      input->buffer_ = pbVar4 + 1;
    }
    else {
      uVar3 = 0;
LAB_0028d9ec:
      uVar3 = io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar9 = (ulong)uVar3;
    }
    uVar7 = (uint)uVar9;
    input->last_tag_ = uVar7;
    if (uVar7 == 0) {
LAB_0028da81:
      bVar2 = false;
      unaff_BPL = true;
    }
    else {
      if ((uVar7 & 7) == 4) {
        if ((output->impl_).end_ <= output->cur_) {
          puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
          output->cur_ = puVar6;
        }
        pbVar4 = output->cur_;
        if (uVar7 < 0x80) {
          *pbVar4 = (byte)uVar9;
          pbVar4 = pbVar4 + 1;
        }
        else {
          *pbVar4 = (byte)uVar9 | 0x80;
          uVar9 = uVar9 >> 7;
          if (uVar7 < 0x4000) {
            pbVar4[1] = (byte)uVar9;
            pbVar4 = pbVar4 + 2;
          }
          else {
            pbVar4 = pbVar4 + 2;
            do {
              pbVar5 = pbVar4;
              uVar7 = (uint)uVar9;
              pbVar5[-1] = (byte)uVar9 | 0x80;
              uVar8 = uVar7 >> 7;
              uVar9 = (ulong)uVar8;
              pbVar4 = pbVar5 + 1;
            } while (0x3fff < uVar7);
            *pbVar5 = (byte)uVar8;
          }
        }
        output->cur_ = pbVar4;
        goto LAB_0028da81;
      }
      bVar2 = SkipField(input,uVar7,output);
      unaff_BPL = unaff_BPL & bVar2;
    }
    if (bVar2 == false) {
      return (bool)unaff_BPL;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
                                 io::CodedOutputStream* output) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}